

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

void __thiscall
gl3cts::PerVertexValidationTest::PerVertexValidationTest
          (PerVertexValidationTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"CommonBug_PerVertexValidation",
             "Conformance test which verifies that various requirements regarding gl_PerVertex block re-declarations, as described by the spec, are followed by the implementation"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_020ede48;
  this->m_fs_id = 0;
  this->m_fs_po_id = 0;
  this->m_gs_id = 0;
  this->m_gs_po_id = 0;
  this->m_pipeline_id = 0;
  this->m_tc_id = 0;
  this->m_tc_po_id = 0;
  this->m_te_id = 0;
  this->m_te_id = 0;
  this->m_te_po_id = 0;
  this->m_vs_id = 0;
  this->m_vs_po_id = 0;
  return;
}

Assistant:

PerVertexValidationTest::PerVertexValidationTest(deqp::Context& context)
	: TestCase(context, "CommonBug_PerVertexValidation",
			   "Conformance test which verifies that various requirements regarding gl_PerVertex block re-declarations,"
			   " as described by the spec, are followed by the implementation")
	, m_fs_id(0)
	, m_fs_po_id(0)
	, m_gs_id(0)
	, m_gs_po_id(0)
	, m_pipeline_id(0)
	, m_tc_id(0)
	, m_tc_po_id(0)
	, m_te_id(0)
	, m_te_po_id(0)
	, m_vs_id(0)
	, m_vs_po_id(0)
{
	/* Left blank on purpose */
}